

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,locale_ref loc)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  basic_appender<char> bVar4;
  undefined1 **ppuVar5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  sign *psVar12;
  long lVar13;
  size_t sVar14;
  undefined1 uVar15;
  undefined8 uVar16;
  basic_specs significand_00;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  buffer<char> *buf;
  char decimal_point;
  char zero;
  bool pointy;
  int significand_size;
  char *significand;
  int exp;
  anon_class_40_8_fd1bf2f9 write;
  int num_zeros;
  undefined1 local_e6 [6];
  undefined1 local_e0 [4];
  sign local_dc;
  basic_appender<char> local_d8;
  format_specs local_d0;
  undefined1 local_c0 [20];
  undefined1 auStack_ac [20];
  format_specs *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char *local_80;
  ulong local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 *local_60;
  int *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  significand_00 = (basic_specs)f->significand;
  uVar17 = f->significand_size;
  uVar9 = (ulong)((uVar17 + 1) - (uint)(s == none));
  local_e6[1] = '0';
  uVar10 = (specs->super_basic_specs).data_;
  local_e6[0] = '.';
  local_e0 = (undefined1  [4])uVar17;
  local_dc = s;
  local_d8.container = out.container;
  local_d0.super_basic_specs = significand_00;
  if ((uVar10 >> 0xe & 1) != 0) {
    local_78 = (ulong)uVar17;
    local_e6[0] = decimal_point_impl<char>(loc);
    uVar17 = (uint)local_78;
    uVar10 = (specs->super_basic_specs).data_;
  }
  uVar16 = auStack_ac._4_8_;
  bVar4.container = local_d8.container;
  uVar1 = f->exponent;
  iVar19 = uVar17 + uVar1;
  iVar7 = specs->precision;
  bVar6 = (byte)uVar10 & 7;
  if (bVar6 == 1) {
LAB_00216369:
    iVar20 = uVar17 + uVar1 + -1;
    if ((uVar10 >> 0xd & 1) == 0) {
      uVar2 = 0;
      if (uVar17 == 1) {
        local_e6[0] = '\0';
        uVar2 = 0;
      }
    }
    else {
      uVar2 = 0;
      if (0 < (int)(iVar7 - uVar17)) {
        uVar2 = (ulong)(iVar7 - uVar17);
      }
      uVar9 = uVar9 + uVar2;
    }
    uVar15 = local_e6[0];
    iVar7 = 1 - iVar19;
    if (0 < iVar19) {
      iVar7 = iVar20;
    }
    lVar13 = 2;
    if (99 < iVar7) {
      lVar13 = (ulong)(999 < iVar7) + 3;
    }
    sVar14 = (3 - (ulong)(local_e6[0] == '\0')) + uVar9 + lVar13;
    local_c0._0_4_ = s;
    auStack_ac[0] = local_e6[0];
    local_c0._16_4_ = uVar17;
    auStack_ac._4_5_ = CONCAT14('0',(int)uVar2);
    auStack_ac._10_2_ = SUB82(uVar16,6);
    auStack_ac._4_8_ =
         CONCAT26(auStack_ac._10_2_,CONCAT15(((uVar10 >> 0xc & 1) == 0) << 5,auStack_ac._4_5_)) |
         0x450000000000;
    auStack_ac._12_4_ = iVar20;
    local_c0._8_8_ = significand_00;
    if (0 < specs->width) {
      bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                        (local_d8,specs,sVar14,sVar14,(anon_class_40_8_fd1bf2f9 *)local_c0);
      return (basic_appender<char>)bVar4.container;
    }
    uVar9 = sVar14 + (local_d8.container)->size_;
    if ((local_d8.container)->capacity_ < uVar9) {
      (*(local_d8.container)->grow_)(local_d8.container,uVar9);
    }
    iVar7 = (int)uVar2;
    if (s != none) {
      sVar14 = (bVar4.container)->size_;
      uVar9 = sVar14 + 1;
      if ((bVar4.container)->capacity_ < uVar9) {
        (*(bVar4.container)->grow_)(bVar4.container,uVar9);
        sVar14 = (bVar4.container)->size_;
        uVar9 = sVar14 + 1;
      }
      (bVar4.container)->size_ = uVar9;
      (bVar4.container)->ptr_[sVar14] = (char)(0x202b2d00 >> ((byte)(s << 3) & 0x1f));
      significand_00 = (basic_specs)local_c0._8_8_;
      uVar15 = auStack_ac[0];
      iVar7 = auStack_ac._4_4_;
      uVar17 = local_c0._16_4_;
    }
    bVar4 = write_significand<fmt::v11::basic_appender<char>,char>
                      (bVar4,(char *)significand_00,uVar17,1,uVar15);
    if (0 < iVar7) {
      bVar4 = fill_n<fmt::v11::basic_appender<char>,int,char>(bVar4,iVar7,auStack_ac + 8);
    }
    uVar15 = auStack_ac[9];
    sVar14 = (bVar4.container)->size_;
    uVar9 = sVar14 + 1;
    if ((bVar4.container)->capacity_ < uVar9) {
      (*(bVar4.container)->grow_)(bVar4.container,uVar9);
      sVar14 = (bVar4.container)->size_;
      uVar9 = sVar14 + 1;
    }
    (bVar4.container)->size_ = uVar9;
    (bVar4.container)->ptr_[sVar14] = uVar15;
    bVar4 = write_exponent<char,fmt::v11::basic_appender<char>>(auStack_ac._12_4_,bVar4);
    return (basic_appender<char>)bVar4.container;
  }
  if ((uVar10 & 7) != 2) {
    iVar20 = 0x10;
    if (0 < iVar7) {
      iVar20 = iVar7;
    }
    if ((iVar19 < -3) || (iVar20 < iVar19)) goto LAB_00216369;
  }
  local_d0.precision = iVar19;
  if (-1 < (int)uVar1) {
    lVar13 = uVar1 + uVar9;
    local_e6._2_4_ = iVar7 - iVar19;
    if ((uVar10 >> 0xd & 1) != 0) {
      lVar13 = lVar13 + 1;
      if (((int)local_e6._2_4_ < 1) && (bVar6 != 2)) {
        local_e6._2_4_ = 0;
      }
      else if (0 < (int)local_e6._2_4_) {
        lVar13 = lVar13 + (ulong)(uint)local_e6._2_4_;
      }
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)&local_70,loc,(bool)((byte)(uVar10 >> 0xe) & 1));
    iVar7 = 0;
    if (local_48 != (digit_grouping<char> *)0x0) {
      psVar12 = (sign *)(local_70._8_8_ + local_70._M_allocated_capacity);
      lVar3 = 0;
      uVar16 = local_70._M_allocated_capacity;
      do {
        if ((sign *)uVar16 == psVar12) {
          uVar15 = *(byte *)((long)psVar12 + -1);
          uVar16 = psVar12;
        }
        else {
          uVar15 = (undefined1)*(sign *)uVar16;
          if ((byte)(uVar15 + 0x81) < 0x82) goto LAB_00216623;
          uVar16 = (sign *)(uVar16 + 1);
        }
        iVar7 = iVar7 + (char)uVar15;
        if (iVar19 <= iVar7) goto LAB_00216623;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_00216623:
    local_c0._0_8_ = &local_dc;
    local_c0._8_8_ = &local_d0;
    unique0x1000049b = local_e0;
    local_90._M_allocated_capacity = (size_type)local_e6;
    local_90._8_8_ = local_e6 + 2;
    local_80 = local_e6 + 1;
    auStack_ac._4_8_ = f;
    auStack_ac._12_8_ = &local_70;
    local_98 = specs;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_&>
                      (local_d8,specs,lVar13 + lVar3,lVar13 + lVar3,
                       (anon_class_72_9_eb40e20e *)local_c0);
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    ppuVar5 = &local_60;
LAB_002167bc:
    if ((undefined1 **)ppuVar5[-2] != ppuVar5) {
      operator_delete(ppuVar5[-2]);
    }
    return (basic_appender<char>)bVar4.container;
  }
  if (0 < iVar19) {
    uVar18 = 0;
    local_e6._2_4_ = iVar7 - uVar17 & (int)(uVar10 << 0x12) >> 0x1f;
    uVar2 = (ulong)(uint)local_e6._2_4_;
    if ((int)local_e6._2_4_ < 1) {
      uVar2 = uVar18;
    }
    digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
              ((digit_grouping<char> *)local_c0,loc,(bool)((byte)(uVar10 >> 0xe) & 1));
    if (local_98 != (format_specs *)0x0) {
      pcVar8 = ((basic_specs *)local_c0._8_8_)->fill_data_ + (long)(local_c0._0_8_ + -4);
      lVar13 = 0;
      pcVar11 = (char *)local_c0._0_8_;
      do {
        if (pcVar11 == pcVar8) {
          uVar15 = pcVar8[-1];
          pcVar11 = pcVar8;
        }
        else {
          uVar15 = *pcVar11;
          if ((byte)(uVar15 + 0x81) < 0x82) goto LAB_00216747;
          pcVar11 = pcVar11 + 1;
        }
        uVar17 = (int)uVar18 + (int)(char)uVar15;
        uVar18 = (ulong)uVar17;
        if (iVar19 <= (int)uVar17) goto LAB_00216747;
        lVar13 = lVar13 + 1;
      } while( true );
    }
    lVar13 = 0;
LAB_00216747:
    sVar14 = uVar2 + uVar9 + 1 + lVar13;
    local_70._M_allocated_capacity = (size_type)&local_dc;
    local_70._8_8_ = &local_d0;
    local_60 = local_e0;
    local_58 = &local_d0.precision;
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_e6;
    local_40._M_allocated_capacity = (size_type)(local_e6 + 2);
    local_40._8_8_ = local_e6 + 1;
    local_48 = (digit_grouping<char> *)local_c0;
    bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_&>
                      (local_d8,specs,sVar14,sVar14,(anon_class_64_8_085c650e *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)auStack_ac._12_8_ != &local_90) {
      operator_delete((void *)auStack_ac._12_8_);
    }
    ppuVar5 = (undefined1 **)(local_c0 + 0x10);
    goto LAB_002167bc;
  }
  iVar20 = -iVar19;
  local_70._M_allocated_capacity._0_4_ = iVar20;
  if (uVar17 == 0) {
    if (SBORROW4(iVar7,iVar20) != iVar7 + iVar19 < 0 && -1 < iVar7) {
      local_70._M_allocated_capacity._0_4_ = iVar7;
      iVar20 = iVar7;
    }
    if (iVar20 == 0) {
      local_e6[2] = (char)((uVar10 & 0x2000) >> 0xd);
      iVar7 = 2 - (uint)((uVar10 & 0x2000) == 0);
      iVar20 = 0;
      goto LAB_002166de;
    }
  }
  local_e6[2] = 1;
  iVar7 = 2;
LAB_002166de:
  sVar14 = (uint)(iVar20 + iVar7) + uVar9;
  local_c0._0_8_ = &local_dc;
  local_c0._8_8_ = local_e6 + 2;
  unique0x00004e80 = local_e6;
  auStack_ac._4_8_ = &local_70;
  auStack_ac._12_8_ = local_e6 + 1;
  local_98 = &local_d0;
  local_90._M_allocated_capacity = (size_type)local_e0;
  bVar4 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_&>
                    (local_d8,specs,sVar14,sVar14,(anon_class_56_7_88befd79 *)local_c0);
  return (basic_appender<char>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}